

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void prvTidyNestedEmphasis(TidyDocImpl *doc,Node *node)

{
  Node **ppNVar1;
  Dict *pDVar2;
  Node *next;
  Node *local_20;
  
  while (node != (Node *)0x0) {
    local_20 = node->next;
    pDVar2 = node->tag;
    if (((pDVar2 == (Dict *)0x0) ||
        (((pDVar2->id != TidyTag_I && (pDVar2->id != TidyTag_B)) || (node->parent == (Node *)0x0))))
       || (node->parent->tag != pDVar2)) {
      ppNVar1 = &node->content;
      node = local_20;
      if (*ppNVar1 != (Node *)0x0) {
        prvTidyNestedEmphasis(doc,*ppNVar1);
      }
    }
    else {
      DiscardContainer(doc,node,&local_20);
      node = local_20;
    }
  }
  return;
}

Assistant:

void TY_(NestedEmphasis)( TidyDocImpl* doc, Node* node )
{
    Node *next;

    while (node)
    {
        next = node->next;

        if ( (nodeIsB(node) || nodeIsI(node))
             && node->parent && node->parent->tag == node->tag)
        {
            /* strip redundant inner element */
            DiscardContainer( doc, node, &next );
            node = next;
            continue;
        }

        if ( node->content )
            TY_(NestedEmphasis)( doc, node->content );

        node = next;
    }
}